

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::parse_u16_array(CBS *cbs,Array<unsigned_short> *out)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  Array<unsigned_short> ret;
  CBS copy;
  
  copy.data = cbs->data;
  copy.len = cbs->len;
  if ((copy.len & 1) == 0) {
    ret.data_ = (unsigned_short *)0x0;
    ret.size_ = 0;
    bVar1 = Array<unsigned_short>::InitUninitialized(&ret,copy.len >> 1);
    if (bVar1) {
      uVar4 = 0xffffffffffffffff;
      lVar3 = 0;
      do {
        uVar4 = uVar4 + 1;
        if (ret.size_ <= uVar4) {
          if (copy.len != 0) {
            __assert_fail("CBS_len(&copy) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                          ,0x9ff,"bool bssl::parse_u16_array(const CBS *, Array<uint16_t> *)");
          }
          bVar1 = true;
          Array<unsigned_short>::operator=(out,&ret);
          goto LAB_00137954;
        }
        iVar2 = CBS_get_u16(&copy,(uint16_t *)((long)ret.data_ + lVar3));
        lVar3 = lVar3 + 2;
      } while (iVar2 != 0);
      bVar1 = false;
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x9fa);
    }
    else {
      bVar1 = false;
    }
LAB_00137954:
    Array<unsigned_short>::~Array(&ret);
  }
  else {
    bVar1 = false;
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x9f0);
  }
  return bVar1;
}

Assistant:

static bool parse_u16_array(const CBS *cbs, Array<uint16_t> *out) {
  CBS copy = *cbs;
  if ((CBS_len(&copy) & 1) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  Array<uint16_t> ret;
  if (!ret.InitForOverwrite(CBS_len(&copy) / 2)) {
    return false;
  }
  for (size_t i = 0; i < ret.size(); i++) {
    if (!CBS_get_u16(&copy, &ret[i])) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  assert(CBS_len(&copy) == 0);
  *out = std::move(ret);
  return true;
}